

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_clearfavors(CHAR_DATA *ch,char *argument)

{
  PC_DATA *pPVar1;
  CHAR_DATA *arg2;
  long lVar2;
  
  arg2 = ch;
  if (*argument != '\0') {
    arg2 = get_char_world(ch,argument);
  }
  if (arg2 != (CHAR_DATA *)0x0) {
    pPVar1 = arg2->pcdata;
    for (lVar2 = -0x14; lVar2 != 0; lVar2 = lVar2 + 4) {
      *(undefined4 *)((long)pPVar1->lesserdata + lVar2) = 0;
      *(undefined4 *)((long)pPVar1->greaterdata + lVar2 + 0x14) = 0;
      *(undefined4 *)((long)pPVar1->greaterdata + lVar2) = 0;
    }
    act("$N\'s favors cleared.",ch,(void *)0x0,arg2,3);
    return;
  }
  send_to_char("They aren\'t here.\n\r",ch);
  return;
}

Assistant:

void do_clearfavors(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	int i;

	if (argument[0] == '\0')
		victim = ch;
	else
		victim = get_char_world(ch, argument);

	if (!victim)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	for (i = 0; i < MAX_DEVIL; i++)
	{
		victim->pcdata->devildata[i] = FAVOR_NONE;
		victim->pcdata->greaterdata[i] = FAVOR_NONE;
		victim->pcdata->lesserdata[i] = FAVOR_NONE;
	}

	act("$N's favors cleared.", ch, 0, victim, TO_CHAR);
}